

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

Reg ra_allocref(ASMState *as,IRRef ref,RegSet allow)

{
  IRIns *pIVar1;
  byte bVar2;
  uint uVar3;
  uint in_EDX;
  uint in_ESI;
  ASMState *in_RDI;
  Reg r;
  RegSet pick;
  IRIns *ir;
  uint local_28;
  uint local_24;
  uint uVar4;
  
  pIVar1 = in_RDI->ir;
  local_24 = in_RDI->freeset & in_EDX;
  uVar4 = in_ESI;
  if (local_24 == 0) {
    local_28 = ra_evict(in_RDI,in_ESI);
    goto LAB_00163f80;
  }
  if ((&pIVar1->field_1)[in_ESI].r < 0xfd) {
    local_28 = (&pIVar1->field_1)[in_ESI].r & 0x7f;
    if ((local_24 >> ((byte)local_28 & 0x1f) & 1) != 0) goto LAB_00163f80;
    if (((in_EDX >> ((byte)local_28 & 0x1f) & 1) != 0) &&
       ((in_RDI->cost[local_28] & 0xffff) < 0x8001)) {
      ra_rematk(in_RDI,in_ESI);
      goto LAB_00163f80;
    }
  }
  if ((in_ESI < in_RDI->loopref) && (((&pIVar1->field_1)[in_ESI].t.irt & 0x40) == 0)) {
    if ((local_24 & (in_RDI->modset ^ 0xffffffff)) != 0) {
      local_24 = (in_RDI->modset ^ 0xffffffff) & local_24;
    }
    local_28 = 0;
    for (; (local_24 & 1) == 0; local_24 = local_24 >> 1 | 0x80000000) {
      local_28 = local_28 + 1;
    }
  }
  else {
    if ((local_24 & 0xf038) != 0) {
      local_24 = local_24 & 0xf038;
    }
    uVar3 = local_24 >> 0x18 | (local_24 & 0xff0000) >> 8 | (local_24 & 0xff00) << 8 |
            local_24 << 0x18;
    local_28 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> local_28 == 0; local_28 = local_28 - 1) {
      }
    }
    local_28 = local_28 ^ 0x18;
  }
LAB_00163f80:
  bVar2 = (byte)local_28;
  (&pIVar1->field_1)[in_ESI].r = bVar2;
  in_RDI->freeset = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & in_RDI->freeset;
  in_RDI->weakset = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
  in_RDI->cost[local_28] = uVar4 * 0x10001 + ((&pIVar1->field_1)[in_ESI].t.irt & 0x40) * 0x10000;
  return local_28;
}

Assistant:

static Reg ra_allocref(ASMState *as, IRRef ref, RegSet allow)
{
  IRIns *ir = IR(ref);
  RegSet pick = as->freeset & allow;
  Reg r;
  lj_assertA(ra_noreg(ir->r),
	     "IR %04d already has reg %d", ref - REF_BIAS, ir->r);
  if (pick) {
    /* First check register hint from propagation or PHI. */
    if (ra_hashint(ir->r)) {
      r = ra_gethint(ir->r);
      if (rset_test(pick, r))  /* Use hint register if possible. */
	goto found;
      /* Rematerialization is cheaper than missing a hint. */
      if (rset_test(allow, r) && emit_canremat(regcost_ref(as->cost[r]))) {
	ra_rematk(as, regcost_ref(as->cost[r]));
	goto found;
      }
      RA_DBGX((as, "hintmiss  $f $r", ref, r));
    }
    /* Invariants should preferably get unmodified registers. */
    if (ref < as->loopref && !irt_isphi(ir->t)) {
      if ((pick & ~as->modset))
	pick &= ~as->modset;
      r = rset_pickbot(pick);  /* Reduce conflicts with inverse allocation. */
    } else {
      /* We've got plenty of regs, so get callee-save regs if possible. */
      if (RID_NUM_GPR > 8 && (pick & ~RSET_SCRATCH))
	pick &= ~RSET_SCRATCH;
      r = rset_picktop(pick);
    }
  } else {
    r = ra_evict(as, allow);
  }
found:
  RA_DBGX((as, "alloc     $f $r", ref, r));
  ir->r = (uint8_t)r;
  rset_clear(as->freeset, r);
  ra_noweak(as, r);
  as->cost[r] = REGCOST_REF_T(ref, irt_t(ir->t));
  return r;
}